

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<32U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_true>::operator/=
          (uintwide_t<32U,_unsigned_int,_void,_true> *this,
          uintwide_t<32U,_unsigned_int,_void,_true> *other)

{
  bool bVar1;
  enable_if_t<true,_uintwide_t<32U,_unsigned_int,_void,_true>_> eVar2;
  reference puVar3;
  iterator puVar4;
  uint *first;
  uintwide_t<32U,_unsigned_int,_void,_false> local_28;
  array<unsigned_int,_1UL> local_24;
  local_unsigned_wide_type b;
  local_unsigned_wide_type a;
  bool denom_was_neg;
  bool numer_was_neg;
  uintwide_t<32U,_unsigned_int,_void,_true> *other_local;
  uintwide_t<32U,_unsigned_int,_void,_true> *this_local;
  
  if (this == other) {
    puVar3 = detail::array_detail::array<unsigned_int,_1UL>::front((array<unsigned_int,_1UL> *)this)
    ;
    *puVar3 = 1;
    puVar4 = detail::array_detail::array<unsigned_int,_1UL>::begin((array<unsigned_int,_1UL> *)this)
    ;
    first = detail::advance_and_point<unsigned_int*,unsigned_int>(puVar4,1);
    puVar4 = detail::array_detail::array<unsigned_int,_1UL>::end((array<unsigned_int,_1UL> *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(first,puVar4,0);
  }
  else {
    bVar1 = is_zero(other);
    if (bVar1) {
      eVar2 = limits_helper_max<true>();
      (this->values).super_array<unsigned_int,_1UL>.elems[0] =
           (value_type_conflict)eVar2.values.super_array<unsigned_int,_1UL>.elems[0];
    }
    else {
      b.values.super_array<unsigned_int,_1UL>.elems[0]._3_1_ =
           is_neg<true>(this,(enable_if_t<true,_int> *)0x0);
      b.values.super_array<unsigned_int,_1UL>.elems[0]._2_1_ =
           is_neg<true>(other,(enable_if_t<true,_int> *)0x0);
      if (((b.values.super_array<unsigned_int,_1UL>.elems[0]._3_1_ & 1) != 0) ||
         ((bool)b.values.super_array<unsigned_int,_1UL>.elems[0]._2_1_)) {
        uintwide_t<32U,_unsigned_int,_void,_false>::uintwide_t<true,_nullptr>
                  ((uintwide_t<32U,_unsigned_int,_void,_false> *)&local_24,this);
        uintwide_t<32U,_unsigned_int,_void,_false>::uintwide_t<true,_nullptr>(&local_28,other);
        if ((b.values.super_array<unsigned_int,_1UL>.elems[0]._3_1_ & 1) != 0) {
          uintwide_t<32U,_unsigned_int,_void,_false>::negate
                    ((uintwide_t<32U,_unsigned_int,_void,_false> *)&local_24);
        }
        if ((b.values.super_array<unsigned_int,_1UL>.elems[0]._2_1_ & 1) != 0) {
          uintwide_t<32U,_unsigned_int,_void,_false>::negate(&local_28);
        }
        uintwide_t<32U,_unsigned_int,_void,_false>::eval_divide_knuth
                  ((uintwide_t<32U,_unsigned_int,_void,_false> *)&local_24,&local_28,
                   (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0);
        if ((b.values.super_array<unsigned_int,_1UL>.elems[0]._3_1_ & 1) !=
            (b.values.super_array<unsigned_int,_1UL>.elems[0]._2_1_ & 1)) {
          uintwide_t<32U,_unsigned_int,_void,_false>::negate
                    ((uintwide_t<32U,_unsigned_int,_void,_false> *)&local_24);
        }
        (this->values).super_array<unsigned_int,_1UL>.elems[0] =
             (value_type_conflict)local_24.elems[0];
      }
      else {
        eval_divide_knuth(this,other,(uintwide_t<32U,_unsigned_int,_void,_true> *)0x0);
      }
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }